

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O3

CURLcode Curl_rtsp_parseheader(connectdata *conn,char *header)

{
  SessionHandle *data;
  int iVar1;
  ushort **ppuVar2;
  size_t __n;
  char *pcVar3;
  uint uVar4;
  CURLcode CVar5;
  long lVar6;
  byte bVar7;
  char *__s1;
  char *pcVar8;
  long CSeq;
  long local_38;
  
  data = conn->data;
  local_38 = 0;
  iVar1 = Curl_raw_nequal("CSeq:",header,5);
  if (iVar1 != 0) {
    iVar1 = __isoc99_sscanf(header + 4,": %ld",&local_38);
    if (iVar1 == 1) {
      *(long *)((long)(data->req).protop + 0x90) = local_38;
      (data->state).rtsp_CSeq_recv = local_38;
      return CURLE_OK;
    }
    Curl_failf(data,"Unable to read the CSeq header: [%s]",header);
    return CURLE_RTSP_CSEQ_ERROR;
  }
  iVar1 = Curl_raw_nequal("Session:",header,8);
  CVar5 = CURLE_OK;
  if (iVar1 == 0) {
    return CURLE_OK;
  }
  bVar7 = header[8];
  if (bVar7 != 0) {
    __s1 = header + 8;
    ppuVar2 = __ctype_b_loc();
    lVar6 = -8 - (long)header;
    do {
      if ((*(byte *)((long)*ppuVar2 + (ulong)bVar7 * 2 + 1) & 0x20) == 0) {
        pcVar3 = (data->set).str[0x22];
        pcVar8 = __s1;
        if (pcVar3 != (char *)0x0) {
          __n = strlen(pcVar3);
          iVar1 = strncmp(__s1,pcVar3,__n);
          if (iVar1 == 0) {
            return CURLE_OK;
          }
          Curl_failf(data,"Got RTSP Session ID Line [%s], but wanted ID [%s]",__s1,pcVar3);
          return CURLE_RTSP_SESSION_ERROR;
        }
        goto LAB_0049068d;
      }
      bVar7 = __s1[1];
      __s1 = __s1 + 1;
      lVar6 = lVar6 + -1;
    } while (bVar7 != 0);
  }
  Curl_failf(data,"Got a blank Session ID");
  return CURLE_OK;
LAB_0049068d:
  do {
    if (((*ppuVar2)[bVar7] & 8) == 0) {
      uVar4 = bVar7 - 0x2b;
      if (0x34 < uVar4) break;
      if ((0x1000000000000dU >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
        if (((ulong)uVar4 != 0x31) || (pcVar8[1] != '$')) break;
        pcVar8 = pcVar8 + 1;
      }
    }
    bVar7 = pcVar8[1];
    pcVar8 = pcVar8 + 1;
  } while (bVar7 != 0);
  pcVar3 = (char *)(*Curl_cmalloc)((size_t)(pcVar8 + lVar6 + 1));
  (data->set).str[0x22] = pcVar3;
  if (pcVar3 == (char *)0x0) {
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
  else {
    memcpy(pcVar3,__s1,(size_t)(pcVar8 + lVar6));
    (pcVar8 + (long)(data->set).str[0x22])[lVar6] = '\0';
  }
  return CVar5;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct connectdata *conn,
                               char *header)
{
  struct SessionHandle *data = conn->data;
  long CSeq = 0;

  if(checkprefix("CSeq:", header)) {
    /* Store the received CSeq. Match is verified in rtsp_done */
    int nc = sscanf(&header[4], ": %ld", &CSeq);
    if(nc == 1) {
      struct RTSP *rtsp = data->req.protop;
      rtsp->CSeq_recv = CSeq; /* mark the request */
      data->state.rtsp_CSeq_recv = CSeq; /* update the handle */
    }
    else {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
  }
  else if(checkprefix("Session:", header)) {
    char *start;

    /* Find the first non-space letter */
    start = header + 8;
    while(*start && ISSPACE(*start))
      start++;

    if(!*start) {
      failf(data, "Got a blank Session ID");
    }
    else if(data->set.str[STRING_RTSP_SESSION_ID]) {
      /* If the Session ID is set, then compare */
      if(strncmp(start, data->set.str[STRING_RTSP_SESSION_ID],
                 strlen(data->set.str[STRING_RTSP_SESSION_ID]))  != 0) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then
         set it */

      /* The session ID can be an alphanumeric or a 'safe' character
       *
       * RFC 2326 15.1 Base Syntax:
       * safe =  "\$" | "-" | "_" | "." | "+"
       * */
      char *end = start;
      while(*end &&
            (ISALNUM(*end) || *end == '-' || *end == '_' || *end == '.' ||
             *end == '+' ||
             (*end == '\\' && *(end + 1) && *(end + 1) == '$' && (++end, 1))))
        end++;

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = malloc(end - start + 1);
      if(data->set.str[STRING_RTSP_SESSION_ID] == NULL)
        return CURLE_OUT_OF_MEMORY;
      memcpy(data->set.str[STRING_RTSP_SESSION_ID], start, end - start);
      (data->set.str[STRING_RTSP_SESSION_ID])[end - start] = '\0';
    }
  }
  return CURLE_OK;
}